

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O0

const_iterator
cmRemoveIndices<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *r,vector<unsigned_long,_std::allocator<unsigned_long>_> *rem)

{
  bool bVar1;
  reference puVar2;
  bool local_89;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  value_type_conflict local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  size_t local_58;
  size_t count;
  value_type_conflict prevRem;
  iterator pivot;
  iterator writer;
  iterator rangeEnd;
  const_iterator remEnd;
  const_iterator remIt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *rem_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r_local;
  
  remEnd = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(rem);
  rangeEnd._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(rem);
  writer = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(r);
  bVar1 = __gnu_cxx::operator==
                    (&remEnd,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&rangeEnd);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&r_local,&writer);
  }
  else {
    pivot = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(r);
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&remEnd);
    std::
    advance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,unsigned_long>
              (&pivot,*puVar2);
    prevRem = (value_type_conflict)pivot._M_current;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&remEnd);
    count = *puVar2;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&remEnd);
    local_58 = 1;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&pivot,&writer);
      local_89 = false;
      if (bVar1) {
        local_89 = __gnu_cxx::operator!=
                             (&remEnd,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&rangeEnd);
      }
      if (local_89 == false) break;
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&remEnd);
      std::
      advance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,unsigned_long>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&prevRem,*puVar2 - count);
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&remEnd);
      count = *puVar2;
      local_68 = pivot._M_current;
      local_70 = prevRem;
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ContainerAlgorithms::
                 RemoveN<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (pivot._M_current,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )prevRem,local_58);
      local_58 = local_58 + 1;
      pivot._M_current = local_60;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&remEnd);
    }
    local_78 = ContainerAlgorithms::
               RemoveN<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         (pivot._M_current,writer._M_current,local_58);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&r_local,&local_78);
  }
  return (const_iterator)
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)r_local;
}

Assistant:

typename Range::const_iterator cmRemoveIndices(Range& r, InputRange const& rem)
{
  typename InputRange::const_iterator remIt = rem.begin();
  typename InputRange::const_iterator remEnd = rem.end();
  const typename Range::iterator rangeEnd = r.end();
  if (remIt == remEnd)
    {
    return rangeEnd;
    }

  typename Range::iterator writer = r.begin();
  std::advance(writer, *remIt);
  typename Range::iterator pivot = writer;
  typename InputRange::value_type prevRem = *remIt;
  ++remIt;
  size_t count = 1;
  for ( ; writer != rangeEnd && remIt != remEnd; ++count, ++remIt)
    {
    std::advance(pivot, *remIt - prevRem);
    prevRem = *remIt;
    writer = ContainerAlgorithms::RemoveN(writer, pivot, count);
    }
  return ContainerAlgorithms::RemoveN(writer, rangeEnd, count);
}